

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O3

void pnga_access_block_ptr(Integer g_a,Integer idx,void *ptr,Integer *ld)

{
  short sVar1;
  short sVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int _ndim_1;
  long lVar11;
  Integer *unaff_R14;
  int _ndim;
  uint uVar12;
  int _index [7];
  Integer lo [7];
  Integer hi [7];
  int local_c8 [8];
  long local_a8 [8];
  Integer *local_68 [7];
  
  lVar9 = g_a + 1000;
  sVar1 = GA[lVar9].ndim;
  if ((idx < 0) || (GA[lVar9].block_total <= idx)) {
    pnga_error("block index outside allowed values",idx);
    unaff_R14 = ld;
  }
  if (GA[lVar9].distr_type - 2U < 3) {
    sVar1 = GA[lVar9].ndim;
    lVar9 = GA[lVar9].num_blocks[0];
    local_a8[0] = (long)(int)idx % lVar9;
    if (1 < (long)sVar1) {
      lVar11 = 0;
      lVar7 = local_a8[0];
      do {
        idx = ((int)idx - lVar7) / lVar9;
        lVar9 = GA[g_a + 1000].num_blocks[lVar11 + 1];
        lVar7 = (long)(int)idx % lVar9;
        local_a8[lVar11 + 1] = lVar7;
        lVar11 = lVar11 + 1;
      } while ((long)sVar1 + -1 != lVar11);
    }
    pnga_access_block_grid_ptr(g_a,local_a8,local_68,ld);
    unaff_R14 = local_68[0];
  }
  else if (GA[lVar9].distr_type == 1) {
    lVar7 = idx % GAnproc;
    if (lVar7 < idx) {
      lVar11 = 0;
      lVar6 = lVar7;
      do {
        sVar2 = GA[lVar9].ndim;
        uVar12 = (uint)sVar2;
        lVar5 = GA[lVar9].num_blocks[0];
        lVar8 = (long)(int)lVar6 % lVar5;
        local_c8[0] = (int)lVar8;
        if (1 < (int)uVar12) {
          lVar10 = 0;
          lVar4 = lVar6;
          do {
            lVar4 = (long)((int)lVar4 - (int)lVar8) / lVar5;
            lVar5 = GA[g_a + 1000].num_blocks[lVar10 + 1];
            lVar8 = (long)(int)lVar4 % lVar5;
            local_c8[lVar10 + 1] = (int)lVar8;
            lVar10 = lVar10 + 1;
          } while ((ulong)uVar12 - 1 != lVar10);
        }
        if (0 < sVar2) {
          lVar5 = 0;
          do {
            iVar3 = *(int *)((long)local_c8 + lVar5);
            lVar8 = *(long *)((long)GA[g_a + 1000].block_dims + lVar5 * 2);
            *(long *)((long)local_a8 + lVar5 * 2) = lVar8 * iVar3 + 1;
            lVar8 = ((long)iVar3 + 1) * lVar8;
            lVar4 = *(long *)((long)GA[g_a + 1000].dims + lVar5 * 2);
            if (lVar4 <= lVar8) {
              lVar8 = lVar4;
            }
            *(long *)((long)local_68 + lVar5 * 2) = lVar8;
            lVar5 = lVar5 + 4;
          } while ((ulong)uVar12 << 2 != lVar5);
        }
        lVar5 = 1;
        if (0 < sVar1) {
          lVar8 = 0;
          do {
            lVar5 = lVar5 * ((long)local_68[lVar8] + (1 - local_a8[lVar8]));
            lVar8 = lVar8 + 1;
          } while (sVar1 != lVar8);
        }
        lVar11 = lVar11 + lVar5;
        lVar6 = lVar6 + GAnproc;
      } while (lVar6 < idx);
    }
    else {
      lVar11 = 0;
    }
    unaff_R14 = (Integer *)(GA[lVar9].ptr[lVar7] + GA[lVar9].elemsize * lVar11);
    sVar2 = GA[lVar9].ndim;
    uVar12 = (uint)sVar2;
    lVar9 = GA[lVar9].num_blocks[0];
    lVar7 = (long)(int)idx % lVar9;
    local_c8[0] = (int)lVar7;
    if (1 < (int)uVar12) {
      lVar11 = 0;
      do {
        idx = (long)((int)idx - (int)lVar7) / lVar9;
        lVar9 = GA[g_a + 1000].num_blocks[lVar11 + 1];
        lVar7 = (long)(int)idx % lVar9;
        local_c8[lVar11 + 1] = (int)lVar7;
        lVar11 = lVar11 + 1;
      } while ((ulong)uVar12 - 1 != lVar11);
    }
    if (0 < sVar2) {
      lVar9 = 0;
      do {
        iVar3 = *(int *)((long)local_c8 + lVar9);
        lVar7 = *(long *)((long)GA[g_a + 1000].block_dims + lVar9 * 2);
        *(long *)((long)local_a8 + lVar9 * 2) = lVar7 * iVar3 + 1;
        lVar7 = ((long)iVar3 + 1) * lVar7;
        lVar11 = *(long *)((long)GA[g_a + 1000].dims + lVar9 * 2);
        if (lVar11 <= lVar7) {
          lVar7 = lVar11;
        }
        *(long *)((long)local_68 + lVar9 * 2) = lVar7;
        lVar9 = lVar9 + 4;
      } while ((ulong)uVar12 << 2 != lVar9);
    }
    if (1 < sVar1) {
      lVar9 = 0;
      do {
        ld[lVar9] = (long)local_68[lVar9] + (1 - local_a8[lVar9]);
        lVar9 = lVar9 + 1;
      } while ((long)sVar1 + -1 != lVar9);
    }
  }
  *(Integer **)ptr = unaff_R14;
  return;
}

Assistant:

void pnga_access_block_ptr(Integer g_a, Integer idx, void* ptr, Integer *ld)
            /* g_a: array handle [input]
             * idx: block index  [input]
             * ptr: pointer to data in block [output]
             * ld:  array of strides for block data [output]
             */
{
  char *lptr;
  Integer  handle = GA_OFFSET + g_a;
  Integer  i, j/*, p_handle*/, nblocks, offset, tsum, inode;
  Integer ndim, lo[MAXDIM], hi[MAXDIM], index;

  
  /*p_handle = GA[handle].p_handle;*/
  nblocks = GA[handle].block_total;
  ndim = GA[handle].ndim;
  index = idx;
  if (index < 0 || index >= nblocks)
    pnga_error("block index outside allowed values",index);

  if (GA[handle].distr_type == BLOCK_CYCLIC) {
    offset = 0;
    inode = index%GAnproc;
    for (i=inode; i<index; i += GAnproc) {
      ga_ownsM(handle,i,lo,hi); 
      tsum = 1;
      for (j=0; j<ndim; j++) {
        tsum *= (hi[j]-lo[j]+1);
      }
      offset += tsum;
    }
    lptr = GA[handle].ptr[inode]+offset*GA[handle].elemsize;

    ga_ownsM(handle,index,lo,hi); 
    for (i=0; i<ndim-1; i++) {
      ld[i] = hi[i]-lo[i]+1;
    }
  } else if (GA[handle].distr_type == SCALAPACK ||
      GA[handle].distr_type == TILED ||
      GA[handle].distr_type == TILED_IRREG) {
    Integer indices[MAXDIM];
    /* find block indices */
    gam_find_block_indices(handle,index,indices);
    /* find pointer */
    pnga_access_block_grid_ptr(g_a, indices, &lptr, ld);
  }
  *(char**)ptr = lptr; 

}